

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

bool __thiscall FIX::Session::nextQueued(Session *this,int num,UtcTimeStamp *timeStamp)

{
  SessionState *this_00;
  string *__lhs;
  bool bVar1;
  bool bVar2;
  signed_int value;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  MsgType msgType;
  Message msg;
  
  Message::Message(&msg);
  MsgType::MsgType(&msgType);
  this_00 = &this->m_state;
  bVar1 = SessionState::retrieve(this_00,num,&msg);
  if (bVar1) {
    IntConvertor::convert_abi_cxx11_(&local_220,(IntConvertor *)(ulong)(uint)num,value);
    std::operator+(&local_200,"Processing QUEUED message: ",&local_220);
    SessionState::onEvent(this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    FieldMap::getField(&msg.m_header.super_FieldMap,(FieldBase *)&msgType);
    __lhs = &msgType.super_StringField.super_FieldBase.m_string;
    bVar2 = std::operator==(__lhs,"A");
    if (!bVar2) {
      bVar2 = std::operator==(__lhs,"2");
      if (!bVar2) {
        next(this,&msg,timeStamp,true);
        goto LAB_001a8978;
      }
    }
    SessionState::incrNextTargetMsgSeqNum(this_00);
  }
LAB_001a8978:
  FieldBase::~FieldBase((FieldBase *)&msgType);
  Message::~Message(&msg);
  return bVar1;
}

Assistant:

bool Session::nextQueued( int num, const UtcTimeStamp& timeStamp )
{
  Message msg;
  MsgType msgType;

  if( m_state.retrieve( num, msg ) )
  {
    m_state.onEvent( "Processing QUEUED message: "
                     + IntConvertor::convert( num ) );
    msg.getHeader().getField( msgType );
    if( msgType == MsgType_Logon
        || msgType == MsgType_ResendRequest )
    {
      m_state.incrNextTargetMsgSeqNum();
    }
    else
    {
      next( msg, timeStamp, true );
    }
    return true;
  }
  return false;
}